

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

int m256v_iszero(m256v *M)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar3 = (ulong)M->n_row;
  bVar8 = (long)uVar3 < 1;
  if (0 < (long)uVar3) {
    uVar1 = M->n_col;
    uVar4 = 0;
    do {
      bVar7 = (int)uVar1 < 1;
      if (0 < (int)uVar1) {
        lVar5 = M->rstride * uVar4;
        if (M->e[lVar5] != '\0') break;
        uVar2 = 1;
        do {
          uVar6 = uVar2;
          if (uVar1 == uVar6) break;
          uVar2 = uVar6 + 1;
        } while (M->e[uVar6 + lVar5] == '\0');
        bVar7 = uVar1 <= uVar6;
      }
      if (!bVar7) break;
      uVar4 = uVar4 + 1;
      bVar8 = uVar3 <= uVar4;
    } while (uVar4 != uVar3);
  }
  return (uint)bVar8;
}

Assistant:

int MV_GEN_N(_iszero)(const MV_GEN_TYPE* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		if (!MV_GEN_N(_row_iszero)(M, r)) {
			return 0;
		}
	}
	return 1;
}